

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http-test.c++
# Opt level: O3

Promise<void> __thiscall
kj::anon_unknown_0::TestWebSocketService::request
          (TestWebSocketService *this,HttpMethod method,StringPtr url,HttpHeaders *headers,
          AsyncInputStream *requestBody,Response *response)

{
  uint uVar1;
  _func_int *p_Var2;
  undefined8 uVar3;
  char *pcVar4;
  size_t sVar5;
  Disposer *node;
  bool bVar6;
  long *plVar7;
  undefined4 in_register_00000034;
  long lVar8;
  HttpHeaderId id;
  StringPtr message;
  DebugExpression<bool> _kjCondition;
  HttpHeaders responseHeaders;
  String local_f8;
  Own<kj::WebSocket,_std::nullptr_t> local_e0;
  undefined8 *local_d0;
  long *local_c8;
  StringPtr local_c0;
  HttpHeaders local_b0;
  undefined1 local_50 [8];
  undefined8 local_48;
  ArrayPtr<const_char> local_40;
  
  lVar8 = CONCAT44(in_register_00000034,method);
  plVar7 = (long *)url.content.size_;
  local_c0.content.ptr = (char *)plVar7;
  local_c0.content.size_ = (size_t)headers;
  bVar6 = HttpHeaders::isWebSocket((HttpHeaders *)requestBody);
  local_f8.content.ptr = (char *)CONCAT71(local_f8.content.ptr._1_7_,bVar6);
  if (!bVar6) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&>
              ((Fault *)&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
               ,0x9ec,FAILED,"headers.isWebSocket()","_kjCondition,",
               (DebugExpression<bool> *)&local_f8);
    kj::_::Debug::Fault::fatal((Fault *)&local_b0);
  }
  HttpHeaders::HttpHeaders(&local_b0,*(HttpHeaderTable **)(lVar8 + 0x10));
  uVar1 = *(uint *)(lVar8 + 0x20);
  p_Var2 = requestBody[1]._vptr_AsyncInputStream[(ulong)uVar1 * 2 + 1];
  if ((_func_int *)0x1 < p_Var2) {
    local_40.ptr = (char *)requestBody[1]._vptr_AsyncInputStream[(ulong)uVar1 * 2];
    uVar3 = *(undefined8 *)(lVar8 + 0x18);
    local_e0.disposer = (Disposer *)0x4d75bf;
    local_e0.ptr = (WebSocket *)0x8;
    local_40.size_ = (size_t)(p_Var2 + -1);
    kj::_::concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
              (&local_f8,(_ *)&local_e0,&local_40,(ArrayPtr<const_char> *)local_40.ptr);
    id.id = uVar1;
    id.table = (HttpHeaderTable *)uVar3;
    id._12_4_ = 0;
    HttpHeaders::set(&local_b0,id,&local_f8);
    sVar5 = local_f8.content.size_;
    pcVar4 = local_f8.content.ptr;
    if ((_func_int **)local_f8.content.ptr != (_func_int **)0x0) {
      local_f8.content.ptr = (char *)0x0;
      local_f8.content.size_ = 0;
      (**(local_f8.content.disposer)->_vptr_ArrayDisposer)
                (local_f8.content.disposer,pcVar4,1,sVar5,sVar5,0);
    }
  }
  if (headers == (HttpHeaders *)0xb) {
    if (*(long *)((long)plVar7 + 3) != 0x74656b636f7362 || *plVar7 != 0x6b636f736265772f)
    goto LAB_003125f9;
    (**(code **)(*__kjCondition + 8))(&local_f8,__kjCondition,&local_b0);
    message.content.size_ = (size_t)"start-inline";
    message.content.ptr = (char *)local_f8.content.size_;
    doWebSocket((WebSocket *)&local_e0,message);
    Promise<void>::attach<kj::Own<kj::WebSocket,decltype(nullptr)>>((Promise<void> *)this,&local_e0)
    ;
    node = local_e0.disposer;
    if ((PromiseArenaMember *)local_e0.disposer != (PromiseArenaMember *)0x0) {
      local_e0.disposer = (Disposer *)0x0;
      kj::_::PromiseDisposer::dispose((PromiseArenaMember *)node);
    }
    sVar5 = local_f8.content.size_;
    if ((long *)local_f8.content.size_ != (long *)0x0) {
      local_f8.content.size_ = 0;
      (**(code **)*(_func_int **)local_f8.content.ptr)
                (local_f8.content.ptr,sVar5 + *(long *)(*(long *)sVar5 + -0x10));
    }
  }
  else {
    if ((headers != (HttpHeaders *)0xe) ||
       (*(long *)((long)plVar7 + 6) != 0x726f7272652d6e || *plVar7 != 0x2d6e72757465722f)) {
LAB_003125f9:
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[16],kj::StringPtr&>
                ((Fault *)&local_f8,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http-test.c++"
                 ,0x9fa,FAILED,(char *)0x0,"\"unexpected path\", url",
                 (char (*) [16])"unexpected path",&local_c0);
      kj::_::Debug::Fault::fatal((Fault *)&local_f8);
    }
    local_50[0] = 1;
    local_48 = 0;
    (**(code **)*__kjCondition)(&local_d0,__kjCondition,0x194,"Not Found",10,&local_b0,local_50);
    plVar7 = local_c8;
    if (local_c8 != (long *)0x0) {
      local_c8 = (long *)0x0;
      (**(code **)*local_d0)(local_d0,(long)plVar7 + *(long *)(*plVar7 + -0x10));
    }
    kj::_::readyNow();
    (this->super_HttpService)._vptr_HttpService = (_func_int **)local_f8.content.ptr;
  }
  HttpHeaders::~HttpHeaders(&local_b0);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<void> request(
      HttpMethod method, kj::StringPtr url, const HttpHeaders& headers,
      kj::AsyncInputStream& requestBody, Response& response) override {
    KJ_ASSERT(headers.isWebSocket());

    HttpHeaders responseHeaders(headerTable);
    KJ_IF_SOME(h, headers.get(hMyHeader)) {
      responseHeaders.set(hMyHeader, kj::str("respond-", h));
    }

    if (url == "/return-error") {
      response.send(404, "Not Found", responseHeaders, uint64_t(0));
      return kj::READY_NOW;
    } else if (url == "/websocket") {
      auto ws = response.acceptWebSocket(responseHeaders);
      return doWebSocket(*ws, "start-inline").attach(kj::mv(ws));
    } else {
      KJ_FAIL_ASSERT("unexpected path", url);
    }
  }